

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.cpp
# Opt level: O3

void __thiscall Trainer::Node::calcAverageStrategy(Node *this)

{
  byte bVar1;
  double *pdVar2;
  double *pdVar3;
  ulong uVar4;
  int a;
  ulong uVar5;
  double dVar6;
  double dVar7;
  
  if (this->mAlreadyCalculated == false) {
    bVar1 = this->mActionNum;
    uVar4 = (ulong)bVar1;
    if (uVar4 != 0) {
      uVar5 = 0;
      memset(this->mAverageStrategy,0,(ulong)((uint)bVar1 * 8));
      dVar6 = 0.0;
      do {
        dVar6 = dVar6 + this->mStrategySum[uVar5];
        uVar5 = uVar5 + 1;
      } while (uVar4 != uVar5);
      if (uVar4 != 0) {
        pdVar2 = this->mStrategySum;
        pdVar3 = this->mAverageStrategy;
        uVar5 = 0;
        do {
          dVar7 = 1.0 / (double)bVar1;
          if (0.0 < dVar6) {
            dVar7 = pdVar2[uVar5] / dVar6;
          }
          pdVar3[uVar5] = dVar7;
          uVar5 = uVar5 + 1;
        } while (uVar4 != uVar5);
      }
    }
    this->mAlreadyCalculated = true;
  }
  return;
}

Assistant:

void Node::calcAverageStrategy() {
    // if average strategy has already been calculated, do nothing to reduce the calculation time
    if (mAlreadyCalculated) {
        return;
    }

    // calculate average strategy
    for (int a = 0; a < mActionNum; ++a) {
        mAverageStrategy[a] = 0.0;
    }
    double normalizingSum = 0.0;
    for (int a = 0; a < mActionNum; ++a) {
        normalizingSum += mStrategySum[a];
    }
    for (int a = 0; a < mActionNum; ++a) {
        if (normalizingSum > 0) {
            mAverageStrategy[a] = mStrategySum[a] / normalizingSum;
        } else {
            mAverageStrategy[a] = 1.0 / (double) mActionNum;
        }
    }
    mAlreadyCalculated = true;
}